

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::WriteFaceArray(ON_Mesh *this,int vcount,int fcount,ON_BinaryArchive *file)

{
  ON_MeshFace *pOVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  ON__INT32 i;
  undefined1 auVar5 [16];
  uchar cvi [4];
  undefined8 local_38;
  
  i = 1;
  if (0xff < vcount) {
    i = (0xffffU < (uint)vcount) + 2 + (uint)(0xffffU < (uint)vcount);
  }
  bVar2 = ON_BinaryArchive::WriteInt(file,i);
  if (i == 1) {
    lVar3 = 0xc;
    lVar4 = 0;
    while ((lVar4 < fcount && (bVar2 != false))) {
      pOVar1 = (this->m_F).m_a;
      cvi[0] = *(uchar *)((long)pOVar1->vi + lVar3 + -0xc);
      cvi[1] = *(uchar *)((long)pOVar1->vi + lVar3 + -8);
      cvi[2] = *(uchar *)((long)pOVar1->vi + lVar3 + -4);
      cvi[3] = *(uchar *)((long)pOVar1->vi + lVar3);
      bVar2 = ON_BinaryArchive::WriteChar(file,4,cvi);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    }
  }
  else if (i == 2) {
    lVar3 = 0;
    lVar4 = 0;
    while ((lVar4 < fcount && (bVar2 != false))) {
      auVar5 = *(undefined1 (*) [16])((long)((this->m_F).m_a)->vi + lVar3);
      auVar5 = pshuflw(auVar5,auVar5,0xe8);
      auVar5 = pshufhw(auVar5,auVar5,0xe8);
      local_38 = CONCAT44(auVar5._8_4_,auVar5._0_4_);
      bVar2 = ON_BinaryArchive::WriteShort(file,4,(ON__UINT16 *)&local_38);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x10;
    }
  }
  else if (i == 4) {
    lVar4 = 0;
    lVar3 = 0;
    while ((lVar3 < fcount && (bVar2 != false))) {
      bVar2 = ON_BinaryArchive::WriteInt(file,4,(ON__INT32 *)((long)((this->m_F).m_a)->vi + lVar4));
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x10;
    }
  }
  return bVar2;
}

Assistant:

bool ON_Mesh::WriteFaceArray( int vcount, int fcount, ON_BinaryArchive& file ) const
{
  unsigned char  cvi[4];
  unsigned short svi[4];
  const int* vi;
  int i_size = 0;
  if ( vcount < 256 ) {
    i_size = 1; // unsigned chars
  }
  else if (vcount < 65536 ) {
    i_size = 2; // unsigned shorts
  }
  else {
    i_size = 4; // 4 byte ints
  }

  bool rc = file.WriteInt( i_size );
  int i;
  switch(i_size) {
  case 1:
    for ( i = 0; i < fcount && rc ; i++ ) {
      vi = m_F[i].vi;
      cvi[0] = (unsigned char)vi[0];
      cvi[1] = (unsigned char)vi[1];
      cvi[2] = (unsigned char)vi[2];
      cvi[3] = (unsigned char)vi[3];
      rc = file.WriteChar( 4, cvi );
    }
    break;
  case 2:
    for ( i = 0; i < fcount && rc ; i++ ) {
      vi = m_F[i].vi;
      svi[0] = (unsigned short)vi[0];
      svi[1] = (unsigned short)vi[1];
      svi[2] = (unsigned short)vi[2];
      svi[3] = (unsigned short)vi[3];
      rc = file.WriteShort( 4, svi );
    }
    break;
  case 4:
    for ( i = 0; i < fcount && rc ; i++ ) {
      rc = file.WriteInt( 4, m_F[i].vi );
    }
    break;
  }

  return rc;
}